

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

double __thiscall osc::ReceivedMessageArgument::AsDoubleUnchecked(ReceivedMessageArgument *this)

{
  anon_union_8_2_94730042 u;
  ReceivedMessageArgument *this_local;
  
  return (double)CONCAT17(*this->argumentPtr_,
                          CONCAT16(this->argumentPtr_[1],
                                   CONCAT15(this->argumentPtr_[2],
                                            CONCAT14(this->argumentPtr_[3],
                                                     CONCAT13(this->argumentPtr_[4],
                                                              CONCAT12(this->argumentPtr_[5],
                                                                       CONCAT11(this->argumentPtr_
                                                                                [6],this->
                                                  argumentPtr_[7])))))));
}

Assistant:

double ReceivedMessageArgument::AsDoubleUnchecked() const
{
#ifdef OSC_HOST_LITTLE_ENDIAN
    union{
        double d;
        char c[8];
    } u;

    u.c[0] = argumentPtr_[7];
    u.c[1] = argumentPtr_[6];
    u.c[2] = argumentPtr_[5];
    u.c[3] = argumentPtr_[4];
    u.c[4] = argumentPtr_[3];
    u.c[5] = argumentPtr_[2];
    u.c[6] = argumentPtr_[1];
    u.c[7] = argumentPtr_[0];

    return u.d;
#else
	return *(double*)argument_;
#endif
}